

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2Mul<unsigned_long>
          (OptimizeInstructions *this,Binary *binary,unsigned_long c)

{
  Const *pCVar1;
  Literal local_40;
  int local_24;
  unsigned_long uStack_20;
  int shifts;
  unsigned_long c_local;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  uStack_20 = c;
  c_local = (unsigned_long)binary;
  binary_local = (Binary *)this;
  local_24 = Bits::countTrailingZeroes(c);
  *(undefined4 *)(c_local + 0x10) = 0x23;
  wasm::Literal::Literal(&local_40,(long)local_24);
  pCVar1 = Expression::cast<wasm::Const>(*(Expression **)(c_local + 0x20));
  wasm::Literal::operator=(&pCVar1->value,&local_40);
  wasm::Literal::~Literal(&local_40);
  return (Expression *)c_local;
}

Assistant:

Expression* optimizePowerOf2Mul(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    auto shifts = Bits::countTrailingZeroes(c);
    binary->op = std::is_same<T, uint32_t>::value ? ShlInt32 : ShlInt64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(shifts));
    return binary;
  }